

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_notif(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node_notif **notifs)

{
  lysp_ext_instance **exts;
  lysp_node **siblings;
  ly_stmt stmt_00;
  lysp_node_notif *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  lysp_node_notif *parent_00;
  lysp_node_notif *plVar4;
  char *pcVar5;
  char *format;
  uint32_t substmt_index;
  ly_ctx *plVar6;
  char *in_R8;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_01;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    parent_00 = (lysp_node_notif *)calloc(1,0x60);
    if (parent_00 == (lysp_node_notif *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      in_R8 = "lysp_stmt_notif";
      LVar3 = LY_EMEM;
      ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
    }
    else {
      plVar1 = *notifs;
      if (*notifs == (lysp_node_notif *)0x0) {
        *notifs = parent_00;
      }
      else {
        do {
          plVar4 = plVar1;
          plVar1 = (lysp_node_notif *)(plVar4->field_0).node.next;
        } while (plVar1 != (lysp_node_notif *)0x0);
        (plVar4->field_0).field_1.next = parent_00;
      }
    }
    if (parent_00 != (lysp_node_notif *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert(plVar6,stmt->arg,0,&(parent_00->field_0).node.name);
      if (LVar3 == LY_SUCCESS) {
        (parent_00->field_0).node.nodetype = 0x400;
        (parent_00->field_0).node.parent = parent;
        stmt_01 = stmt->child;
        LVar3 = LY_SUCCESS;
        if (stmt_01 != (lysp_stmt *)0x0) {
          exts = &(parent_00->field_0).node.exts;
          siblings = &parent_00->child;
          do {
            stmt_00 = stmt_01->kw;
            if ((int)stmt_00 < 0x8000) {
              if ((int)stmt_00 < 0x800) {
                if ((int)stmt_00 < 0x200) {
                  if (stmt_00 == LY_STMT_ANYDATA) {
                    plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (*(byte *)&plVar2[2].schema < 2) {
                      if (ctx == (lysp_ctx *)0x0) {
                        plVar6 = (ly_ctx *)0x0;
                      }
                      else {
                        plVar6 = (ly_ctx *)**(undefined8 **)plVar2;
                      }
                      pcVar5 = "anydata";
LAB_0016a4c4:
                      format = 
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ;
                      goto LAB_0016a4d2;
                    }
                  }
                  else if (stmt_00 != LY_STMT_ANYXML) goto LAB_0016a446;
                  LVar3 = lysp_stmt_any(ctx,stmt_01,(lysp_node *)parent_00,siblings);
                }
                else if (stmt_00 == LY_STMT_CHOICE) {
                  LVar3 = lysp_stmt_case(ctx,stmt_01,(lysp_node *)parent_00,siblings);
                }
                else {
                  if (stmt_00 != LY_STMT_CONTAINER) goto LAB_0016a446;
                  LVar3 = lysp_stmt_container(ctx,stmt_01,(lysp_node *)parent_00,siblings);
                }
              }
              else if ((int)stmt_00 < 0x2000) {
                if (stmt_00 == LY_STMT_GROUPING) {
                  LVar3 = lysp_stmt_grouping(ctx,stmt_01,(lysp_node *)parent_00,
                                             &parent_00->groupings);
                }
                else {
                  if (stmt_00 != LY_STMT_LEAF) goto LAB_0016a446;
                  LVar3 = lysp_stmt_leaf(ctx,stmt_01,(lysp_node *)parent_00,siblings);
                }
              }
              else if (stmt_00 == LY_STMT_LEAF_LIST) {
                LVar3 = lysp_stmt_leaflist(ctx,stmt_01,(lysp_node *)parent_00,siblings);
              }
              else {
                if (stmt_00 != LY_STMT_LIST) goto LAB_0016a446;
                LVar3 = lysp_stmt_list(ctx,stmt_01,(lysp_node *)parent_00,siblings);
              }
            }
            else if ((int)stmt_00 < 0x1d0000) {
              if ((int)stmt_00 < 0xf0000) {
                if (stmt_00 == LY_STMT_USES) {
                  LVar3 = lysp_stmt_uses(ctx,stmt_01,(lysp_node *)parent_00,siblings);
                }
                else {
                  substmt_index = (int)parent_00 + 0x20;
                  if (stmt_00 != LY_STMT_DESCRIPTION) goto LAB_0016a446;
LAB_0016a271:
                  in_R8 = (char *)exts;
                  LVar3 = lysp_stmt_text_field
                                    (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
                }
              }
              else if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
                in_R8 = (char *)exts;
                LVar3 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_NOTIFICATION,0,exts);
              }
              else {
                if (stmt_00 != LY_STMT_IF_FEATURE) goto LAB_0016a446;
                LVar3 = lysp_stmt_qnames(ctx,stmt_01,&(parent_00->field_0).node.iffeatures,
                                         (yang_arg)exts,(lysp_ext_instance **)in_R8);
              }
            }
            else if ((int)stmt_00 < 0x2c0000) {
              if (stmt_00 != LY_STMT_MUST) {
                substmt_index = (int)parent_00 + 0x28;
                if (stmt_00 == LY_STMT_REFERENCE) goto LAB_0016a271;
LAB_0016a446:
                if (ctx == (lysp_ctx *)0x0) {
                  plVar6 = (ly_ctx *)0x0;
                }
                else {
                  plVar6 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar5 = lyplg_ext_stmt2str(stmt_00);
                format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0016a4d2:
                ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar5,"notification");
                return LY_EVALID;
              }
              plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if (*(byte *)&plVar2[2].schema < 2) {
                if (ctx == (lysp_ctx *)0x0) {
                  plVar6 = (ly_ctx *)0x0;
                }
                else {
                  plVar6 = (ly_ctx *)**(undefined8 **)plVar2;
                }
                pcVar5 = "must";
                goto LAB_0016a4c4;
              }
              LVar3 = lysp_stmt_restrs(ctx,stmt_01,&parent_00->musts);
            }
            else if (stmt_00 == LY_STMT_STATUS) {
              LVar3 = lysp_stmt_status(ctx,stmt_01,&(parent_00->field_0).node.flags,exts);
            }
            else {
              if (stmt_00 != LY_STMT_TYPEDEF) goto LAB_0016a446;
              LVar3 = lysp_stmt_typedef(ctx,stmt_01,(lysp_node *)parent_00,&parent_00->typedefs);
            }
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            stmt_01 = stmt_01->next;
            LVar3 = LY_SUCCESS;
          } while (stmt_01 != (lysp_stmt *)0x0);
        }
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_notif(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node_notif **notifs)
{
    struct lysp_node_notif *notif;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    LY_LIST_NEW_RET(PARSER_CTX(ctx), notifs, notif, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &notif->name));
    notif->nodetype = LYS_NOTIF;
    notif->parent = parent;

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &notif->dsc, Y_STR_ARG, &notif->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &notif->iffeatures, Y_STR_ARG, &notif->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &notif->ref, Y_STR_ARG, &notif->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &notif->flags, &notif->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "notification");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(lysp_stmt_any(ctx, child, &notif->node, &notif->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(lysp_stmt_case(ctx, child, &notif->node, &notif->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(lysp_stmt_container(ctx, child, &notif->node, &notif->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(lysp_stmt_leaf(ctx, child, &notif->node, &notif->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(lysp_stmt_leaflist(ctx, child, &notif->node, &notif->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(lysp_stmt_list(ctx, child, &notif->node, &notif->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(lysp_stmt_uses(ctx, child, &notif->node, &notif->child));
            break;

        case LY_STMT_MUST:
            PARSER_CHECK_STMTVER2_RET(ctx, "must", "notification");
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &notif->musts));
            break;
        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(lysp_stmt_typedef(ctx, child, &notif->node, &notif->typedefs));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(lysp_stmt_grouping(ctx, child, &notif->node, &notif->groupings));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_NOTIFICATION, 0, &notif->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "notification");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}